

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::anon_unknown_0::StderrLogSink::Send
          (StderrLogSink *this,LogEntry *entry)

{
  LogSeverity LVar1;
  once_flag oVar2;
  bool bVar3;
  LogSeverityAtLeast LVar4;
  uint32_t uVar5;
  size_t sVar6;
  long lVar7;
  pointer pcVar8;
  char *pcVar9;
  size_type sVar10;
  char *pcVar11;
  byte bVar12;
  string_view message;
  string_view message_00;
  char acStack_78 [96];
  
  bVar12 = 0;
  LVar1 = entry->severity_;
  LVar4 = StderrThreshold();
  if (((int)LVar4 <= (int)LVar1) || (bVar3 = IsInitialized(), !bVar3)) {
    if ((__atomic_base<unsigned_int>)
        Send::warn_if_not_initialized.control_.super___atomic_base<unsigned_int>._M_i !=
        (__atomic_base<unsigned_int>)0xdd) {
      if (((((__atomic_base<unsigned_int>)
             Send::warn_if_not_initialized.control_.super___atomic_base<unsigned_int>._M_i !=
             (__atomic_base<unsigned_int>)0x0) &&
           ((__atomic_base<unsigned_int>)
            Send::warn_if_not_initialized.control_.super___atomic_base<unsigned_int>._M_i !=
            (__atomic_base<unsigned_int>)0xdd)) &&
          ((__atomic_base<unsigned_int>)
           Send::warn_if_not_initialized.control_.super___atomic_base<unsigned_int>._M_i !=
           (__atomic_base<unsigned_int>)0x5a308d2)) &&
         ((__atomic_base<unsigned_int>)
          Send::warn_if_not_initialized.control_.super___atomic_base<unsigned_int>._M_i !=
          (__atomic_base<unsigned_int>)0x65c2937b)) {
        raw_log_internal::RawLog
                  (kFatal,"call_once.h",0xa4,"Unexpected value for control word: 0x%lx");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/call_once.h"
                      ,0xa4,
                      "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/log/internal/log_sink_set.cc:99:46), Args = <>]"
                     );
      }
      LOCK();
      bVar3 = (__atomic_base<unsigned_int>)
              Send::warn_if_not_initialized.control_.super___atomic_base<unsigned_int>._M_i ==
              (__atomic_base<unsigned_int>)0x0;
      if (bVar3) {
        Send::warn_if_not_initialized.control_.super___atomic_base<unsigned_int>._M_i =
             (atomic<unsigned_int>)(__atomic_base<unsigned_int>)0x65c2937b;
      }
      UNLOCK();
      if ((bVar3) ||
         (uVar5 = base_internal::SpinLockWait
                            (&Send::warn_if_not_initialized.control_,3,
                             (SpinLockWaitTransition *)
                             base_internal::
                             CallOnceImpl<absl::lts_20250127::log_internal::(anonymous_namespace)::StderrLogSink::Send(absl::lts_20250127::LogEntry_const&)::{lambda()#1}>(std::atomic<unsigned_int>*,absl::lts_20250127::base_internal::SchedulingMode,absl::lts_20250127::log_internal::(anonymous_namespace)::StderrLogSink::Send(absl::lts_20250127::LogEntry_const&)::{lambda()#1}&&)
                             ::trans,SCHEDULE_COOPERATIVE_AND_KERNEL), uVar5 == 0)) {
        bVar3 = IsInitialized();
        if (!bVar3) {
          pcVar9 = 
          "WARNING: All log messages before absl::InitializeLog() is called are written to STDERR\n"
          ;
          pcVar11 = acStack_78;
          for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
            *(undefined8 *)pcVar11 = *(undefined8 *)pcVar9;
            pcVar9 = pcVar9 + ((ulong)bVar12 * -2 + 1) * 8;
            pcVar11 = (char *)((long)pcVar11 + ((ulong)bVar12 * -2 + 1) * 8);
          }
          sVar6 = strlen(acStack_78);
          message_00._M_str = acStack_78;
          message_00._M_len = sVar6;
          WriteToStderr(message_00,kWarning);
        }
        oVar2.control_.super___atomic_base<unsigned_int>._M_i =
             Send::warn_if_not_initialized.control_.super___atomic_base<unsigned_int>._M_i;
        LOCK();
        Send::warn_if_not_initialized.control_.super___atomic_base<unsigned_int>._M_i =
             (atomic<unsigned_int>)(__atomic_base<unsigned_int>)0xdd;
        UNLOCK();
        if ((__atomic_base<unsigned_int>)oVar2.control_.super___atomic_base<unsigned_int>._M_i ==
            (__atomic_base<unsigned_int>)0x5a308d2) {
          AbslInternalSpinLockWake_lts_20250127(&Send::warn_if_not_initialized.control_,true);
        }
      }
    }
    sVar10 = (entry->stacktrace_)._M_string_length;
    if (sVar10 == 0) {
      pcVar8 = (entry->text_message_with_prefix_and_newline_and_nul_).ptr_;
      sVar10 = (entry->text_message_with_prefix_and_newline_and_nul_).len_ - 1;
    }
    else {
      pcVar8 = (entry->stacktrace_)._M_dataplus._M_p;
    }
    message._M_str = pcVar8;
    message._M_len = sVar10;
    WriteToStderr(message,entry->severity_);
  }
  return;
}

Assistant:

void Send(const absl::LogEntry& entry) override {
    if (entry.log_severity() < absl::StderrThreshold() &&
        absl::log_internal::IsInitialized()) {
      return;
    }

    ABSL_CONST_INIT static absl::once_flag warn_if_not_initialized;
    absl::call_once(warn_if_not_initialized, []() {
      if (absl::log_internal::IsInitialized()) return;
      const char w[] =
          "WARNING: All log messages before absl::InitializeLog() is called"
          " are written to STDERR\n";
      absl::log_internal::WriteToStderr(w, absl::LogSeverity::kWarning);
    });

    if (!entry.stacktrace().empty()) {
      absl::log_internal::WriteToStderr(entry.stacktrace(),
                                        entry.log_severity());
    } else {
      // TODO(b/226937039): do this outside else condition once we avoid
      // ReprintFatalMessage
      absl::log_internal::WriteToStderr(
          entry.text_message_with_prefix_and_newline(), entry.log_severity());
    }
  }